

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFromObject
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  bool bVar1;
  int iVar2;
  Printer *in_RCX;
  char *in_RDX;
  Printer *in_RSI;
  FieldDescriptor *field;
  int i;
  Printer *in_stack_00000030;
  GeneratorOptions *in_stack_00000038;
  Generator *in_stack_00000040;
  FieldDescriptor *in_stack_00000188;
  Printer *in_stack_00000190;
  GeneratorOptions *in_stack_00000198;
  Generator *in_stack_000001a0;
  int local_50;
  string local_40 [16];
  Descriptor *in_stack_ffffffffffffffd0;
  GeneratorOptions *in_stack_ffffffffffffffd8;
  
  io::Printer::Print<>(in_RCX,(char *)in_stack_ffffffffffffffd8);
  GenerateObjectTypedef(in_stack_00000040,in_stack_00000038,in_stack_00000030,_i);
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  io::Printer::Print<char[10],std::__cxx11::string>
            (in_RSI,in_RDX,&in_RCX->variable_delimiter_,&in_stack_ffffffffffffffd8->output_dir);
  std::__cxx11::string::~string(local_40);
  local_50 = 0;
  while( true ) {
    iVar2 = Descriptor::field_count((Descriptor *)in_RCX);
    if (iVar2 <= local_50) break;
    Descriptor::field((Descriptor *)in_RCX,local_50);
    bVar1 = anon_unknown_0::IgnoreField((FieldDescriptor *)0x46afc9);
    if (!bVar1) {
      GenerateClassFieldFromObject
                (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188);
    }
    local_50 = local_50 + 1;
  }
  io::Printer::Print<>(in_RCX,(char *)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void Generator::GenerateClassFromObject(const GeneratorOptions& options,
                                        io::Printer* printer,
                                        const Descriptor* desc) const {
  printer->Print("if (jspb.Message.GENERATE_FROM_OBJECT) {\n\n");

  GenerateObjectTypedef(options, printer, desc);

  printer->Print(
      "/**\n"
      " * Loads data from an object into a new instance of this proto.\n"
      " * @param {!$classname$.ObjectFormat} obj\n"
      " *     The object representation of this proto to load the data from.\n"
      " * @return {!$classname$}\n"
      " */\n"
      "$classname$.fromObject = function(obj) {\n"
      "  var msg = new $classname$();\n",
      "classname", GetMessagePath(options, desc));

  for (int i = 0; i < desc->field_count(); i++) {
    const FieldDescriptor* field = desc->field(i);
    if (!IgnoreField(field)) {
      GenerateClassFieldFromObject(options, printer, field);
    }
  }

  printer->Print(
      "  return msg;\n"
      "};\n"
      "}\n\n");
}